

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::MedianFunction::Bind
          (MedianFunction *this,ClientContext *context,AggregateFunction *function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  reference this_00;
  pointer pEVar1;
  QuantileBindData *this_01;
  AggregateFunction local_148;
  
  this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,0);
  pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (this_00);
  GetAggregate(&local_148,&pEVar1->return_type);
  AggregateFunction::operator=(function,&local_148);
  local_148.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_02476990;
  if (local_148.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_148.function_info.internal.
               super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_148.super_BaseScalarFunction);
  Value::DECIMAL((Value *)&local_148,5,'\x02','\x01');
  this_01 = (QuantileBindData *)operator_new(0x40);
  QuantileBindData::QuantileBindData(this_01,(Value *)&local_148);
  *(QuantileBindData **)this = this_01;
  Value::~Value((Value *)&local_148);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> Bind(ClientContext &context, AggregateFunction &function,
	                                     vector<unique_ptr<Expression>> &arguments) {
		function = GetAggregate(arguments[0]->return_type);
		return make_uniq<QuantileBindData>(Value::DECIMAL(int16_t(5), 2, 1));
	}